

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_type.c
# Opt level: O0

size_t value_type_count(void *v)

{
  type_id tVar1;
  size_t sVar2;
  value in_RDI;
  type_id id;
  value unaff_retaddr;
  undefined8 local_8;
  
  tVar1 = value_type_id(unaff_retaddr);
  if ((tVar1 == 9) || (tVar1 == 10)) {
    sVar2 = value_type_size(in_RDI);
    local_8 = sVar2 >> 3;
  }
  else if (tVar1 == 0x14) {
    local_8 = 0;
  }
  else {
    local_8 = 1;
  }
  return local_8;
}

Assistant:

size_t value_type_count(void *v)
{
	const type_id id = value_type_id(v);

	if (id == TYPE_ARRAY || id == TYPE_MAP)
	{
		/* Array and map can contain multiple values */
		return value_type_size(v) / sizeof(const value);
	}
	else if (id == TYPE_INVALID)
	{
		/* Invalid does not contain any value */
		return 0;
	}

	/* Rest of values only can contain one value */
	return 1;
}